

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_end(nk_context *ctx)

{
  nk_property_state *__s;
  nk_edit_state *__s_00;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  nk_panel_type nVar9;
  uint uVar10;
  nk_window *pnVar11;
  nk_panel *pnVar12;
  nk_panel *pnVar13;
  nk_window *pnVar14;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var15;
  undefined1 auVar16 [16];
  nk_vec2 nVar17;
  bool bVar18;
  nk_panel *pnVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  uint *puVar23;
  nk_panel *pnVar24;
  nk_page_element *pe;
  nk_window *pnVar25;
  nk_flags nVar26;
  nk_flags *pnVar27;
  nk_context *in;
  ulong uVar28;
  nk_command_buffer *b;
  bool bVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect rect_03;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  nk_flags local_13c;
  nk_vec2 local_138;
  undefined8 uStack_130;
  nk_flags *local_120;
  undefined1 local_118 [24];
  nk_style *local_100;
  nk_rect local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  nk_rect local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4028,"void nk_end(struct nk_context *)");
  }
  pnVar11 = ctx->current;
  if (pnVar11 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4029,"void nk_end(struct nk_context *)");
  }
  pnVar12 = pnVar11->layout;
  if (pnVar12 == (nk_panel *)0x0) goto LAB_00116e55;
  nVar9 = pnVar12->type;
  if (nVar9 == NK_PANEL_WINDOW) {
    if ((pnVar11->flags & 0x2000) != 0) goto LAB_00116e55;
    in = (nk_context *)0x0;
    if ((pnVar12->flags & 0x1400) == 0) {
      in = ctx;
    }
LAB_001160e0:
    local_100 = &ctx->style;
    local_120 = &pnVar12->flags;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar11->buffer,r);
    nVar9 = pnVar12->type;
    nVar26 = pnVar12->flags;
  }
  else {
    local_100 = &ctx->style;
    local_120 = &pnVar12->flags;
    nVar26 = pnVar12->flags;
    in = (nk_context *)0x0;
    if ((nVar26 & 0x1400) == 0) {
      in = ctx;
    }
    if ((nVar9 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                 NK_PANEL_GROUP)) == NK_PANEL_NONE) goto LAB_001160e0;
  }
  b = &pnVar11->buffer;
  local_138 = (ctx->style).window.scrollbar_size;
  uStack_130 = 0;
  nVar17 = nk_panel_get_padding(local_100,nVar9);
  pnVar27 = local_120;
  fVar30 = (pnVar12->row).height + pnVar12->at_y;
  auVar16._8_4_ = extraout_XMM0_Dc;
  auVar16._0_4_ = nVar17.x;
  auVar16._4_4_ = nVar17.y;
  auVar16._12_4_ = extraout_XMM0_Dd;
  pnVar12->at_y = fVar30;
  local_118._0_16_ = auVar16;
  if ((nVar26 & 0x8800) == 0x800) {
    fVar31 = (pnVar12->bounds).y;
    if (fVar30 < (pnVar12->bounds).h + fVar31) {
      (pnVar12->bounds).h = fVar30 - fVar31;
    }
    local_118._4_4_ = nVar17.y;
    rect.y = fVar31;
    rect.x = (pnVar11->bounds).x;
    rect.h = (float)local_118._4_4_;
    rect.w = (pnVar11->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar12->border + (float)local_118._0_4_;
    rect_00.y = (pnVar12->bounds).y;
    rect_00.x = (pnVar11->bounds).x;
    rect_00.h = (pnVar12->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = (pnVar12->bounds).x + (pnVar12->bounds).w;
    fVar30 = pnVar12->border + (float)local_118._0_4_;
    if ((*pnVar12->offset_y == 0) && ((*pnVar27 & 0x20) == 0)) {
      fVar30 = fVar30 + local_138.x;
    }
    rect_01.y = (pnVar12->bounds).y;
    rect_01.h = (pnVar12->bounds).h;
    rect_01.w = fVar30;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    if (0.0 < pnVar12->footer_height) {
      rect_02.y = (pnVar12->bounds).y + (pnVar12->bounds).h;
      rect_02.x = (pnVar11->bounds).x;
      rect_02.h = pnVar12->footer_height;
      rect_02.w = (pnVar11->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
    }
  }
  if (((*pnVar27 & 0x8020) == 0) &&
     (pnVar11->scrollbar_hiding_timer <= 4.0 && pnVar11->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar12->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == NK_PANEL_NONE) {
      if (pnVar11 == ctx->active) {
        bVar29 = pnVar12->has_scrolling != 0;
      }
      else {
        bVar29 = false;
      }
      if (in != (nk_context *)0x0) {
        bVar18 = bVar29;
        if ((in->input).mouse.scroll_delta.y <= 0.0) {
          bVar18 = (bool)(0.0 < (in->input).mouse.scroll_delta.x & bVar29);
        }
        if (bVar18 != false) {
          pnVar11->scrolled = 1;
          goto LAB_001163f0;
        }
      }
      pnVar11->scrolled = 0;
    }
    else {
      pnVar13 = pnVar11->layout;
      pnVar19 = pnVar13;
      do {
        pnVar24 = pnVar19;
        pnVar19 = pnVar24->parent;
        pnVar14 = pnVar11;
      } while (pnVar24->parent != (nk_panel *)0x0);
      do {
        pnVar25 = pnVar14;
        pnVar14 = pnVar25->parent;
      } while (pnVar14 != (nk_window *)0x0);
      if (((pnVar25 == ctx->active) && (pnVar12->has_scrolling != 0)) && (in != (nk_context *)0x0))
      {
        uVar2 = (pnVar12->bounds).x;
        uVar6 = (pnVar12->bounds).y;
        fVar30 = (in->input).mouse.pos.x;
        bVar29 = false;
        if ((float)uVar2 <= fVar30) {
          uVar3 = (pnVar12->bounds).w;
          uVar7 = (pnVar12->bounds).h;
          if (fVar30 < (float)uVar2 + (float)uVar3) {
            fVar30 = (in->input).mouse.pos.y;
            bVar29 = false;
            if (((float)uVar6 <= fVar30) && (fVar30 < (float)uVar6 + (float)uVar7)) {
              fVar30 = (pnVar24->clip).x;
              if ((((float)uVar2 + (float)uVar3 < fVar30) ||
                  ((fVar30 + (pnVar24->clip).w < (float)uVar2 ||
                   (fVar30 = (pnVar24->clip).y, (float)uVar6 + (float)uVar7 < fVar30)))) ||
                 (fVar30 + (pnVar24->clip).h < (float)uVar6)) goto LAB_001162b3;
              for (pnVar19 = pnVar13->parent; pnVar19 != (nk_panel *)0x0; pnVar19 = pnVar19->parent)
              {
                pnVar13->has_scrolling = 0;
                pnVar13 = pnVar19;
              }
              pnVar13->has_scrolling = 0;
              bVar29 = true;
            }
          }
        }
      }
      else {
LAB_001162b3:
        bVar29 = false;
      }
    }
LAB_001163f0:
    local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
    fVar30 = (pnVar12->bounds).y;
    scroll.x = (pnVar12->bounds).x + (pnVar12->bounds).w + (float)local_118._0_4_;
    fVar31 = (pnVar12->bounds).h;
    scroll.y = fVar30;
    scroll.h = fVar31;
    scroll.w = local_138.x;
    fVar30 = nk_do_scrollbarv((nk_flags *)&local_f8,b,scroll,(uint)bVar29,(float)*pnVar12->offset_y,
                              (float)(int)(pnVar12->at_y - fVar30),fVar31 * 0.1,fVar31 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar12->offset_y = (nk_uint)(long)fVar30;
    if ((in != (nk_context *)0x0) && (bVar29 != false)) {
      (in->input).mouse.scroll_delta.y = 0.0;
    }
    local_13c = 0;
    fVar30 = (pnVar12->bounds).x;
    fVar35 = (pnVar12->bounds).y + (pnVar12->bounds).h;
    fVar31 = pnVar12->max_x;
    fVar33 = (float)(int)(fVar31 - fVar30);
    font = (ctx->style).font;
    local_f8.h = 1.0;
    if (1.0 <= local_138.y) {
      local_f8.h = local_138.y;
    }
    fVar36 = local_f8.h + local_f8.h;
    fVar32 = (pnVar12->bounds).w;
    local_f8.w = fVar36;
    if (fVar36 <= fVar32) {
      local_f8.w = fVar32;
    }
    local_f8._0_8_ = CONCAT44(fVar35,fVar30);
    fVar32 = 0.0;
    if (local_f8.w < fVar33) {
      fVar34 = (float)*pnVar12->offset_x;
      fVar32 = fVar31 * 0.05;
      local_c8 = ZEXT416((uint)fVar33);
      local_e8._0_4_ = local_f8.w;
      local_e8._4_4_ = 0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      local_d8._4_4_ = 0;
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      local_50.y = fVar35;
      local_50.h = local_f8.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_78 = ZEXT416((uint)fVar36);
        local_a8 = ZEXT416((uint)fVar35);
        local_e8 = ZEXT416((uint)local_f8.w);
        local_d8 = ZEXT416((uint)fVar30);
        fVar33 = fVar32;
        if (fVar31 * 0.005 <= fVar32) {
          fVar33 = fVar31 * 0.005;
        }
        local_98 = ZEXT416((uint)local_f8.h);
        local_68 = CONCAT44(fVar35,fVar30);
        uStack_60 = 0;
        bounds.y = fVar35;
        bounds.x = fVar30;
        bounds.h = local_f8.h;
        bounds.w = local_f8.h;
        local_88 = local_f8.h;
        fStack_84 = local_f8.h;
        fStack_80 = local_f8.h;
        fStack_7c = local_f8.h;
        iVar20 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar30 = 0.0;
        if (iVar20 != 0) {
          fVar30 = fVar33;
        }
        fVar34 = fVar34 - fVar30;
        fVar30 = (float)local_d8._0_4_ + (float)local_e8._0_4_;
        local_e8._0_4_ = (float)local_e8._0_4_ - (float)local_78._0_4_;
        bounds_00.h = fStack_84;
        bounds_00.w = local_88;
        bounds_00.y = (float)local_68._4_4_;
        bounds_00.x = fVar30 - (float)local_98._0_4_;
        iVar20 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (iVar20 != 0) {
          fVar34 = fVar34 + fVar33;
        }
        fVar30 = (float)local_d8._0_4_ + (float)local_98._0_4_;
        local_f8.x = fVar30;
        fVar33 = (float)local_c8._0_4_;
        local_50.y = (float)local_a8._0_4_;
        local_50.h = (float)local_98._0_4_;
      }
      if ((float)local_e8._0_4_ <= fVar32) {
        fVar32 = (float)local_e8._0_4_;
      }
      if (fVar33 - (float)local_e8._0_4_ <= fVar34) {
        fVar34 = fVar33 - (float)local_e8._0_4_;
      }
      fVar31 = 0.0;
      if (0.0 <= fVar34) {
        fVar31 = fVar34;
      }
      fVar35 = (ctx->style).scrollh.border;
      nVar17 = (ctx->style).scrollh.padding;
      fVar36 = nVar17.x;
      fVar34 = nVar17.y;
      local_b8.x = (fVar31 / fVar33) * (float)local_e8._0_4_ + fVar30 + fVar35 + fVar36;
      local_b8.y = local_50.y + fVar35 + fVar34;
      local_b8.w = ((float)local_e8._0_4_ / fVar33) * (float)local_e8._0_4_ -
                   (fVar36 + fVar36 + fVar35 + fVar35);
      local_b8.h = local_50.h - (fVar34 + fVar34 + fVar35 + fVar35);
      local_d8._0_4_ = fVar30;
      local_50.x = local_b8.w + local_b8.x;
      local_40.w = local_b8.x - fVar30;
      local_50.w = (fVar30 + (float)local_e8._0_4_) - local_50.x;
      local_f8.w = (float)local_e8._0_4_;
      local_40.x = fVar30;
      local_40.y = local_50.y;
      local_40.h = local_50.h;
      fVar32 = nk_scrollbar_behavior
                         (&local_13c,&in->input,(uint)bVar29,&local_f8,&local_b8,&local_40,&local_50
                          ,fVar31,fVar33,fVar32,NK_HORIZONTAL);
      local_b8.x = (fVar32 / (float)local_c8._0_4_) * (float)local_e8._0_4_ + (float)local_d8._0_4_;
      p_Var15 = (ctx->style).scrollh.draw_begin;
      if (p_Var15 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var15)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_13c,&(ctx->style).scrollh,&local_f8,&local_b8);
      p_Var15 = (ctx->style).scrollh.draw_end;
      if (p_Var15 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var15)(b,(ctx->style).scrollh.userdata);
      }
    }
    *pnVar12->offset_x = (nk_uint)(long)fVar32;
    pnVar27 = local_120;
  }
  if ((pnVar11->flags & 0x80) == 0) {
LAB_001168a5:
    pnVar11->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar30 = (ctx->input).mouse.delta.x;
    if ((((fVar30 != 0.0) || (NAN(fVar30))) || (fVar30 = (ctx->input).mouse.delta.y, fVar30 != 0.0))
       || (NAN(fVar30))) {
      iVar20 = nk_window_is_hovered(ctx);
      bVar29 = iVar20 != 0;
LAB_001168e3:
      if ((bVar29) || ((ctx->last_widget_state & 2) != 0)) goto LAB_001168a5;
    }
    else {
      fVar30 = (ctx->input).mouse.scroll_delta.y;
      iVar20 = nk_window_is_hovered(ctx);
      bVar29 = iVar20 != 0;
      pnVar27 = local_120;
      if (fVar30 != 0.0 || !bVar29) goto LAB_001168e3;
    }
    pnVar11->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar11->scrollbar_hiding_timer;
  }
  uVar21 = *pnVar27;
  if ((uVar21 & 1) != 0) {
    nVar9 = pnVar12->type;
    lVar22 = 0x1cc4;
    if ((int)nVar9 < 0x20) {
      if (nVar9 == NK_PANEL_GROUP) {
        lVar22 = 0x1cd8;
      }
      else if (nVar9 == NK_PANEL_POPUP) {
        lVar22 = 0x1cc8;
      }
      else if (nVar9 == NK_PANEL_CONTEXTUAL) {
        lVar22 = 0x1cd0;
      }
    }
    else if (nVar9 == NK_PANEL_COMBO) {
      lVar22 = 0x1ccc;
    }
    else if ((nVar9 == NK_PANEL_MENU) || (nVar9 == NK_PANEL_TOOLTIP)) {
      lVar22 = 0x1cd4;
    }
    if ((short)uVar21 < 0) {
      fVar30 = (ctx->style).window.border + (pnVar11->bounds).y + pnVar12->header_height;
    }
    else if ((uVar21 >> 0xb & 1) == 0) {
      fVar30 = (pnVar11->bounds).y + (pnVar11->bounds).h;
    }
    else {
      fVar30 = (pnVar12->bounds).y + (pnVar12->bounds).h + pnVar12->footer_height;
    }
    uVar4 = (pnVar11->bounds).x;
    uVar8 = (pnVar11->bounds).y;
    rect_03.y = (float)uVar8;
    rect_03.x = (float)uVar4;
    uVar5 = (pnVar11->bounds).w;
    rect_03.h = fVar30 - (float)uVar8;
    rect_03.w = (float)uVar5;
    nk_stroke_rect(b,rect_03,0.0,pnVar12->border,
                   *(nk_color *)((long)local_100->cursors + lVar22 + -8));
    uVar21 = pnVar12->flags;
  }
  if ((in != (nk_context *)0x0) && ((uVar21 & 0x8004) == 4)) {
    fVar30 = (pnVar12->bounds).x;
    fVar31 = (pnVar12->bounds).y + (pnVar12->bounds).h;
    if ((uVar21 >> 9 & 1) == 0) {
      local_118._0_4_ = fVar30 + (pnVar12->bounds).w + (float)local_118._0_4_;
    }
    else {
      local_118._0_4_ = fVar30 + (float)local_118._0_4_ * -0.5;
    }
    if ((uVar21 & 0x20) != 0) {
      local_118._0_4_ = (float)local_118._0_4_ - local_138.x;
    }
    local_118._4_4_ = fVar31;
    local_118._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar31;
      r_00.x = (float)local_118._0_4_;
      r_00.w = local_138.x;
      r_00.h = local_138.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar33 = local_138.x + (float)local_118._0_4_;
      fVar30 = (float)local_118._0_4_;
      if ((uVar21 >> 9 & 1) == 0) {
        fVar30 = fVar33;
        fVar33 = (float)local_118._0_4_;
      }
      nk_fill_triangle(b,fVar30,fVar31,fVar30,local_138.y + fVar31,fVar33,local_138.y + fVar31,
                       (ctx->style).window.scaler.data.color);
    }
    if (((((pnVar11->flags & 0x1000) == 0) &&
         (fVar30 = (in->input).mouse.buttons[0].clicked_pos.x, (float)local_118._0_4_ <= fVar30)) &&
        (fVar30 < local_138.x + (float)local_118._0_4_)) &&
       (((fVar30 = (in->input).mouse.buttons[0].clicked_pos.y, (float)local_118._4_4_ <= fVar30 &&
         (fVar30 < local_138.y + (float)local_118._4_4_)) &&
        ((in->input).mouse.buttons[0].down == 1)))) {
      fVar30 = (ctx->style).window.min_size.x;
      fVar31 = (ctx->style).window.min_size.y;
      fVar33 = (in->input).mouse.delta.x;
      uVar21 = *pnVar27;
      fVar35 = fVar33;
      if ((uVar21 >> 9 & 1) != 0) {
        fVar35 = -fVar33;
        (pnVar11->bounds).x = (pnVar11->bounds).x + fVar33;
      }
      fVar36 = (pnVar11->bounds).w + fVar35;
      fVar32 = (float)local_118._0_4_;
      if ((fVar30 <= fVar36) &&
         ((fVar35 < 0.0 || ((0.0 < fVar35 && ((float)local_118._0_4_ <= (in->input).mouse.pos.x)))))
         ) {
        (pnVar11->bounds).w = fVar36;
        fVar32 = fVar33 + (float)local_118._0_4_;
      }
      fVar30 = (float)local_118._4_4_;
      if ((uVar21 >> 0xb & 1) == 0) {
        fVar33 = (in->input).mouse.delta.y;
        fVar35 = (pnVar11->bounds).h + fVar33;
        if ((fVar31 < fVar35) &&
           ((fVar33 < 0.0 || ((0.0 < fVar33 && ((float)local_118._4_4_ <= (in->input).mouse.pos.y)))
            ))) {
          (pnVar11->bounds).h = fVar35;
          fVar30 = fVar33 + (float)local_118._4_4_;
        }
      }
      (ctx->style).cursor_active = (ctx->style).cursors[6];
      nVar17.y = local_138.y * 0.5 + fVar30;
      nVar17.x = local_138.x * 0.5 + fVar32;
      (in->input).mouse.buttons[0].clicked_pos = nVar17;
    }
  }
  uVar21 = pnVar12->flags;
  if ((pnVar12->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    if ((uVar21 >> 0xd & 1) == 0) {
      (pnVar11->buffer).end = (ctx->memory).allocated;
      if ((pnVar11->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar11->popup).buf.parent + 8) =
             (pnVar11->popup).buf.end;
      }
    }
    else {
      (pnVar11->buffer).begin = 0;
      (pnVar11->buffer).end = 0;
      (pnVar11->buffer).last = 0;
      (pnVar11->buffer).clip = nk_null_rect;
      uVar21 = *pnVar27;
    }
  }
  if ((uVar21 >> 0x10 & 1) != 0) {
    uVar21 = uVar21 & 0xfffeefff;
    *pnVar27 = uVar21;
  }
  pnVar11->flags = uVar21;
  iVar20 = (pnVar11->property).active;
  if (iVar20 == 0) {
    uVar21 = (pnVar11->property).seq;
LAB_00116d43:
    (pnVar11->property).old = uVar21;
    (pnVar11->property).prev = iVar20;
    (pnVar11->property).seq = 0;
  }
  else {
    uVar10 = (pnVar11->property).seq;
    uVar21 = (pnVar11->property).old;
    if ((uVar21 == uVar10) || (uVar21 = uVar10, iVar20 != (pnVar11->property).prev))
    goto LAB_00116d43;
    __s = &pnVar11->property;
    uVar28 = (ulong)__s & 3;
    if (uVar28 == 0) {
      (pnVar11->property).select_start = 0;
      (pnVar11->property).select_end = 0;
      (pnVar11->property).name = 0;
      (pnVar11->property).seq = 0;
      (pnVar11->property).buffer[0x38] = '\0';
      (pnVar11->property).buffer[0x39] = '\0';
      (pnVar11->property).buffer[0x3a] = '\0';
      (pnVar11->property).buffer[0x3b] = '\0';
      (pnVar11->property).buffer[0x3c] = '\0';
      (pnVar11->property).buffer[0x3d] = '\0';
      (pnVar11->property).buffer[0x3e] = '\0';
      (pnVar11->property).buffer[0x3f] = '\0';
      (pnVar11->property).length = 0;
      (pnVar11->property).cursor = 0;
      (pnVar11->property).buffer[0x28] = '\0';
      (pnVar11->property).buffer[0x29] = '\0';
      (pnVar11->property).buffer[0x2a] = '\0';
      (pnVar11->property).buffer[0x2b] = '\0';
      (pnVar11->property).buffer[0x2c] = '\0';
      (pnVar11->property).buffer[0x2d] = '\0';
      (pnVar11->property).buffer[0x2e] = '\0';
      (pnVar11->property).buffer[0x2f] = '\0';
      (pnVar11->property).buffer[0x30] = '\0';
      (pnVar11->property).buffer[0x31] = '\0';
      (pnVar11->property).buffer[0x32] = '\0';
      (pnVar11->property).buffer[0x33] = '\0';
      (pnVar11->property).buffer[0x34] = '\0';
      (pnVar11->property).buffer[0x35] = '\0';
      (pnVar11->property).buffer[0x36] = '\0';
      (pnVar11->property).buffer[0x37] = '\0';
      (pnVar11->property).buffer[0x18] = '\0';
      (pnVar11->property).buffer[0x19] = '\0';
      (pnVar11->property).buffer[0x1a] = '\0';
      (pnVar11->property).buffer[0x1b] = '\0';
      (pnVar11->property).buffer[0x1c] = '\0';
      (pnVar11->property).buffer[0x1d] = '\0';
      (pnVar11->property).buffer[0x1e] = '\0';
      (pnVar11->property).buffer[0x1f] = '\0';
      (pnVar11->property).buffer[0x20] = '\0';
      (pnVar11->property).buffer[0x21] = '\0';
      (pnVar11->property).buffer[0x22] = '\0';
      (pnVar11->property).buffer[0x23] = '\0';
      (pnVar11->property).buffer[0x24] = '\0';
      (pnVar11->property).buffer[0x25] = '\0';
      (pnVar11->property).buffer[0x26] = '\0';
      (pnVar11->property).buffer[0x27] = '\0';
      (pnVar11->property).buffer[8] = '\0';
      (pnVar11->property).buffer[9] = '\0';
      (pnVar11->property).buffer[10] = '\0';
      (pnVar11->property).buffer[0xb] = '\0';
      (pnVar11->property).buffer[0xc] = '\0';
      (pnVar11->property).buffer[0xd] = '\0';
      (pnVar11->property).buffer[0xe] = '\0';
      (pnVar11->property).buffer[0xf] = '\0';
      (pnVar11->property).buffer[0x10] = '\0';
      (pnVar11->property).buffer[0x11] = '\0';
      (pnVar11->property).buffer[0x12] = '\0';
      (pnVar11->property).buffer[0x13] = '\0';
      (pnVar11->property).buffer[0x14] = '\0';
      (pnVar11->property).buffer[0x15] = '\0';
      (pnVar11->property).buffer[0x16] = '\0';
      (pnVar11->property).buffer[0x17] = '\0';
      __s->active = 0;
      __s->prev = 0;
      (pnVar11->property).buffer[0] = '\0';
      (pnVar11->property).buffer[1] = '\0';
      (pnVar11->property).buffer[2] = '\0';
      (pnVar11->property).buffer[3] = '\0';
      (pnVar11->property).buffer[4] = '\0';
      (pnVar11->property).buffer[5] = '\0';
      (pnVar11->property).buffer[6] = '\0';
      (pnVar11->property).buffer[7] = '\0';
      (pnVar11->property).old = 0;
      (pnVar11->property).state = 0;
    }
    else {
      memset(__s,0,4 - uVar28);
      puVar1 = (undefined8 *)((long)__s + (4 - uVar28));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      *(undefined4 *)(puVar1 + 0xc) = 0;
      memset((void *)((long)puVar1 + 100),0,uVar28);
    }
  }
  iVar20 = (pnVar11->edit).active;
  if (iVar20 == 0) {
    uVar21 = (pnVar11->edit).seq;
LAB_00116dd4:
    (pnVar11->edit).old = uVar21;
    (pnVar11->edit).prev = iVar20;
    (pnVar11->edit).seq = 0;
  }
  else {
    uVar10 = (pnVar11->edit).seq;
    uVar21 = (pnVar11->edit).old;
    if ((uVar21 == uVar10) || (uVar21 = uVar10, iVar20 != (pnVar11->edit).prev)) goto LAB_00116dd4;
    __s_00 = &pnVar11->edit;
    uVar28 = (ulong)__s_00 & 3;
    if (uVar28 == 0) {
      (pnVar11->edit).sel_end = 0;
      (pnVar11->edit).scrollbar.x = 0;
      *(undefined8 *)&(pnVar11->edit).scrollbar.y = 0;
      (pnVar11->edit).prev = 0;
      (pnVar11->edit).cursor = 0;
      (pnVar11->edit).sel_start = 0;
      (pnVar11->edit).sel_end = 0;
      __s_00->name = 0;
      __s_00->seq = 0;
      (pnVar11->edit).old = 0;
      (pnVar11->edit).active = 0;
    }
    else {
      memset(__s_00,0,4 - uVar28);
      puVar1 = (undefined8 *)((long)__s_00 + (4 - uVar28));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      memset(puVar1 + 5,0,uVar28);
    }
  }
  if ((pnVar11->popup).active_con == 0) {
    uVar21 = (pnVar11->popup).con_count;
LAB_00116e1b:
    puVar23 = &(pnVar11->popup).con_count;
    (pnVar11->popup).con_old = uVar21;
  }
  else {
    uVar21 = (pnVar11->popup).con_old;
    if (uVar21 == (pnVar11->popup).con_count) goto LAB_00116e1b;
    puVar23 = &(pnVar11->popup).active_con;
    (pnVar11->popup).con_count = 0;
    (pnVar11->popup).con_old = 0;
  }
  *puVar23 = 0;
  (pnVar11->popup).combo_count = 0;
  if ((pnVar12->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3efa,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_00116e55:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}